

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O2

RangeValue __thiscall CoreML::RangeValue::operator+(RangeValue *this,size_t other)

{
  ulong uVar1;
  RangeValue RVar2;
  RangeValue retval;
  RangeValue local_20;
  
  RangeValue(&local_20);
  if (this->_isUnbound == false) {
    local_20._val = other + this->_val;
    uVar1 = 0;
  }
  else {
    uVar1 = (ulong)(uint)local_20._0_4_;
  }
  RVar2._val = local_20._val;
  RVar2._0_8_ = uVar1;
  return RVar2;
}

Assistant:

RangeValue RangeValue::operator+ (size_t other) const {
    RangeValue retval;
    if (!_isUnbound)
        retval.set(_val + other);
    return retval;
}